

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void __thiscall
FFTAnalyzer::AnalyzeOutput
          (FFTAnalyzer *this,float *data,int numchannels,int numsamples,float decaySpeed)

{
  float *pfVar1;
  float local_50;
  float *tmp;
  float a;
  int n_3;
  int n_2;
  int n_1;
  int n;
  float decaySpeed_local;
  int numsamples_local;
  int numchannels_local;
  float *data_local;
  FFTAnalyzer *this_local;
  
  CheckInitialized(this);
  for (n_2 = 0; n_2 < this->spectrumSize - numsamples; n_2 = n_2 + 1) {
    this->obuffer[n_2] = this->obuffer[n_2 + numsamples];
  }
  for (n_3 = 0; n_3 < numsamples; n_3 = n_3 + 1) {
    this->obuffer[(n_3 + this->spectrumSize) - numsamples] = data[n_3 * numchannels];
  }
  for (a = 0.0; (int)a < this->spectrumSize; a = (float)((int)a + 1)) {
    UnityComplexNumberT<float>::Set
              (this->cspec + (int)a,this->obuffer[(int)a] * this->window[(int)a],0.0);
  }
  FFT::Forward(this->cspec,this->spectrumSize,true);
  for (tmp._4_4_ = 0; tmp._4_4_ < this->spectrumSize / 2; tmp._4_4_ = tmp._4_4_ + 1) {
    local_50 = UnityComplexNumberT<float>::Magnitude(this->cspec + tmp._4_4_);
    if (local_50 < this->ospec2[tmp._4_4_] || local_50 == this->ospec2[tmp._4_4_]) {
      local_50 = this->ospec2[tmp._4_4_] * decaySpeed;
    }
    this->ospec1[tmp._4_4_] = local_50;
  }
  pfVar1 = this->ispec1;
  this->ispec1 = this->ispec2;
  this->ispec2 = pfVar1;
  pfVar1 = this->ospec1;
  this->ospec1 = this->ospec2;
  this->ospec2 = pfVar1;
  if (this->numSpectraReady < 2) {
    this->numSpectraReady = this->numSpectraReady + 1;
  }
  return;
}

Assistant:

void FFTAnalyzer::AnalyzeOutput(float* data, int numchannels, int numsamples, float decaySpeed)
{
    CheckInitialized();

    for (int n = 0; n < spectrumSize - numsamples; n++)
        obuffer[n] = obuffer[n + numsamples];
    for (int n = 0; n < numsamples; n++)
        obuffer[n + spectrumSize - numsamples] = data[n * numchannels];
    for (int n = 0; n < spectrumSize; n++)
        cspec[n].Set(obuffer[n] * window[n], 0.0f);
    Forward(cspec, spectrumSize, true);
    for (int n = 0; n < spectrumSize / 2; n++)
    {
        float a = cspec[n].Magnitude();
        ospec1[n] = (a > ospec2[n]) ? a : ospec2[n] * decaySpeed;
    }

    float* tmp;
    tmp = ispec1; ispec1 = ispec2; ispec2 = tmp;
    tmp = ospec1; ospec1 = ospec2; ospec2 = tmp;

    if (numSpectraReady < 2)
        numSpectraReady++;
}